

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  u32 uVar4;
  uchar *buf;
  long in_RCX;
  byte *in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  Mem *pMem;
  u16 u;
  u32 idx;
  u32 d;
  uchar *aKey;
  u32 serial_type;
  u32 szHdr;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint serial_type_00;
  ushort local_42;
  uint local_40;
  uint local_3c;
  u32 local_10;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  buf = *(uchar **)(in_RCX + 8);
  *(undefined1 *)(in_RCX + 0x1e) = 0;
  if (*in_RDX < 0x80) {
    local_c = (uint)*in_RDX;
    serial_type_00 = 1;
  }
  else {
    bVar3 = sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ),
                               (u32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
    ;
    serial_type_00 = (uint)bVar3;
  }
  local_3c = local_c;
  local_42 = 0;
  local_40 = serial_type_00;
  do {
    uVar2 = in_stack_ffffffffffffffa8 & 0xffffff;
    if (local_40 < local_c) {
      uVar2 = CONCAT13(local_3c <= in_ESI,(int3)in_stack_ffffffffffffffa8);
    }
    in_stack_ffffffffffffffa8 = uVar2;
    if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') break;
    local_10 = 0xaaaaaaaa;
    if (in_RDX[local_40] < 0x80) {
      local_10 = (u32)in_RDX[local_40];
      in_stack_ffffffffffffffa4 = 1;
    }
    else {
      bVar3 = sqlite3GetVarint32((uchar *)CONCAT44(serial_type_00,in_stack_ffffffffffffffa8),
                                 (u32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ));
      in_stack_ffffffffffffffa4 = (uint)bVar3;
    }
    local_40 = in_stack_ffffffffffffffa4 + local_40;
    buf[0x16] = *(uchar *)(in_RDI + 4);
    *(undefined8 *)(buf + 0x18) = *(undefined8 *)(in_RDI + 0x10);
    buf[0x20] = '\0';
    buf[0x21] = '\0';
    buf[0x22] = '\0';
    buf[0x23] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    sqlite3VdbeSerialGet
              (buf,serial_type_00,
               (Mem *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    uVar4 = sqlite3VdbeSerialTypeLen(local_10);
    local_3c = uVar4 + local_3c;
    buf = buf + 0x38;
    local_42 = local_42 + 1;
  } while (local_42 < *(ushort *)(in_RCX + 0x1c));
  if ((in_ESI < local_3c) && (local_42 != 0)) {
    sqlite3VdbeMemSetNull((Mem *)0x187436);
  }
  *(ushort *)(in_RCX + 0x1c) = local_42;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  u32 d;
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=(u32)nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    d += sqlite3VdbeSerialTypeLen(serial_type);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  if( d>(u32)nKey && u ){
    assert( CORRUPT_DB );
    /* In a corrupt record entry, the last pMem might have been set up using
    ** uninitialized memory. Overwrite its value with NULL, to prevent
    ** warnings from MSAN. */
    sqlite3VdbeMemSetNull(pMem-1);
  }
  assert( u<=pKeyInfo->nKeyField + 1 );
  p->nField = u;
}